

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O2

uint32_t MurmurHash2A(void *key,int len,uint32_t seed)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint32_t h;
  uint32_t l;
  
  for (iVar3 = len; 3 < iVar3; iVar3 = iVar3 + -4) {
    iVar1 = *key;
    key = (void *)((long)key + 4);
    seed = seed * 0x5bd1e995 ^
           ((uint)(iVar1 * 0x5bd1e995) >> 0x18 ^ iVar1 * 0x5bd1e995) * 0x5bd1e995;
  }
  uVar2 = 0;
  if (iVar3 != 1) {
    if (iVar3 != 2) {
      if (iVar3 != 3) goto LAB_0015df3f;
      uVar2 = (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar2 = uVar2 | (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar2 = (*key ^ uVar2) * 0x5bd1e995;
LAB_0015df3f:
  uVar2 = (seed * 0x5bd1e995 ^ (uVar2 >> 0x18 ^ uVar2) * 0x5bd1e995) * 0x5bd1e995 ^
          ((uint)(len * 0x5bd1e995) >> 0x18 ^ len * 0x5bd1e995) * 0x5bd1e995;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

uint32_t MurmurHash2A ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;
  uint32_t l = len;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    mmix(h,k);

    data += 4;
    len -= 4;
  }

  uint32_t t = 0;

  switch(len)
  {
  case 3: t ^= data[2] << 16;
  case 2: t ^= data[1] << 8;
  case 1: t ^= data[0];
  };

  mmix(h,t);
  mmix(h,l);

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}